

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

void strcpy_url(char *output,char *url)

{
  bool bVar1;
  char *local_30;
  char *optr;
  uchar *iptr;
  _Bool left;
  char *url_local;
  char *output_local;
  
  bVar1 = true;
  local_30 = output;
  for (optr = url; *optr != '\0'; optr = optr + 1) {
    if (*optr == ' ') {
      if (bVar1) {
        *local_30 = '%';
        local_30[1] = '2';
        local_30[2] = '0';
        local_30 = local_30 + 3;
      }
      else {
        *local_30 = '+';
        local_30 = local_30 + 1;
      }
    }
    else {
      if (*optr == '?') {
        bVar1 = false;
      }
      if ((byte)*optr < 0x80) {
        *local_30 = *optr;
        local_30 = local_30 + 1;
      }
      else {
        curl_msnprintf(local_30,4,"%%%02x",(ulong)(byte)*optr);
        local_30 = local_30 + 3;
      }
    }
  }
  *local_30 = '\0';
  return;
}

Assistant:

static void strcpy_url(char *output, const char *url)
{
  /* we must add this with whitespace-replacing */
  bool left=TRUE;
  const unsigned char *iptr;
  char *optr = output;
  for(iptr = (unsigned char *)url;    /* read from here */
      *iptr;         /* until zero byte */
      iptr++) {
    switch(*iptr) {
    case '?':
      left=FALSE;
      /* fall through */
    default:
      if(*iptr >= 0x80) {
        snprintf(optr, 4, "%%%02x", *iptr);
        optr += 3;
      }
      else
        *optr++=*iptr;
      break;
    case ' ':
      if(left) {
        *optr++='%'; /* add a '%' */
        *optr++='2'; /* add a '2' */
        *optr++='0'; /* add a '0' */
      }
      else
        *optr++='+'; /* add a '+' here */
      break;
    }
  }
  *optr=0; /* zero terminate output buffer */

}